

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

int xmlBufAddLen(xmlBufPtr buf,size_t len)

{
  size_t len_local;
  xmlBufPtr buf_local;
  
  if (((buf == (xmlBufPtr)0x0) || ((buf->flags & 3) != 0)) || ((buf->flags & 4) != 0)) {
    buf_local._4_4_ = -1;
  }
  else {
    if ((buf->size != (ulong)buf->compat_size) && (buf->compat_size < 0x7fffffff)) {
      buf->size = (ulong)buf->compat_size;
    }
    if ((buf->use != (ulong)buf->compat_use) && (buf->compat_use < 0x7fffffff)) {
      buf->use = (ulong)buf->compat_use;
    }
    if (buf->size - buf->use < len) {
      buf_local._4_4_ = -1;
    }
    else {
      buf->use = len + buf->use;
      buf->content[buf->use] = '\0';
      if (buf->size < 0x7fffffff) {
        buf->compat_size = (uint)buf->size;
      }
      else {
        buf->compat_size = 0x7fffffff;
      }
      if (buf->use < 0x7fffffff) {
        buf->compat_use = (uint)buf->use;
      }
      else {
        buf->compat_use = 0x7fffffff;
      }
      buf_local._4_4_ = 0;
    }
  }
  return buf_local._4_4_;
}

Assistant:

int
xmlBufAddLen(xmlBufPtr buf, size_t len) {
    if ((buf == NULL) || (BUF_ERROR(buf)) || (BUF_STATIC(buf)))
        return(-1);
    CHECK_COMPAT(buf)
    if (len > buf->size - buf->use)
        return(-1);
    buf->use += len;
    buf->content[buf->use] = 0;
    UPDATE_COMPAT(buf)
    return(0);
}